

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O0

void If_ManDerefNodeCutSet(If_Man_t *p,If_Obj_t *pObj)

{
  int iVar1;
  If_Obj_t *pIVar2;
  If_Obj_t *pFanin;
  If_Obj_t *pObj_local;
  If_Man_t *p_local;
  
  iVar1 = If_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("If_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                  ,0x26d,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
  }
  if (-1 < pObj->nVisits) {
    if (pObj->nVisits == 0) {
      If_ManCutSetRecycle(p,pObj->pCutSet);
      pObj->pCutSet = (If_Set_t *)0x0;
    }
    pIVar2 = If_ObjFanin0(pObj);
    if (0 < pIVar2->nVisits) {
      iVar1 = If_ObjIsCi(pIVar2);
      if ((iVar1 == 0) && (iVar1 = pIVar2->nVisits + -1, pIVar2->nVisits = iVar1, iVar1 == 0)) {
        If_ManCutSetRecycle(p,pIVar2->pCutSet);
        pIVar2->pCutSet = (If_Set_t *)0x0;
      }
      pIVar2 = If_ObjFanin1(pObj);
      if (0 < pIVar2->nVisits) {
        iVar1 = If_ObjIsCi(pIVar2);
        if ((iVar1 == 0) && (iVar1 = pIVar2->nVisits + -1, pIVar2->nVisits = iVar1, iVar1 == 0)) {
          If_ManCutSetRecycle(p,pIVar2->pCutSet);
          pIVar2->pCutSet = (If_Set_t *)0x0;
        }
        return;
      }
      __assert_fail("pFanin->nVisits > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                    ,0x281,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
    }
    __assert_fail("pFanin->nVisits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                  ,0x278,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
  }
  __assert_fail("pObj->nVisits >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifMan.c"
                ,0x26f,"void If_ManDerefNodeCutSet(If_Man_t *, If_Obj_t *)");
}

Assistant:

void If_ManDerefNodeCutSet( If_Man_t * p, If_Obj_t * pObj )
{
    If_Obj_t * pFanin;
    assert( If_ObjIsAnd(pObj) );
    // consider the node
    assert( pObj->nVisits >= 0 );
    if ( pObj->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pObj->pCutSet );
        If_ManCutSetRecycle( p, pObj->pCutSet );
        pObj->pCutSet = NULL;
    }
    // consider the first fanin
    pFanin = If_ObjFanin0(pObj);
    assert( pFanin->nVisits > 0 );
    if ( !If_ObjIsCi(pFanin) && --pFanin->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pFanin->pCutSet );
        If_ManCutSetRecycle( p, pFanin->pCutSet );
        pFanin->pCutSet = NULL;
    }
    // consider the second fanin
    pFanin = If_ObjFanin1(pObj);
    assert( pFanin->nVisits > 0 );
    if ( !If_ObjIsCi(pFanin) && --pFanin->nVisits == 0 )
    {
//        Mem_FixedEntryRecycle( p->pMemSet, (char *)pFanin->pCutSet );
        If_ManCutSetRecycle( p, pFanin->pCutSet );
        pFanin->pCutSet = NULL;
    }
}